

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicClosure.cpp
# Opt level: O3

void CATCH2_INTERNAL_TEMPLATE_TEST_21<true,TemplatedClosure<sl::functional::BasicInvokePolicy,TestPolicy>::type>
               (void)

{
  StringRef message;
  StringRef message_00;
  bool bVar1;
  StringRef macroName;
  StringRef macroName_00;
  AssertionHandler catchAssertionHandler;
  ReusableStringStream local_118;
  string local_100;
  AssertionHandler local_e0;
  StringRef local_98;
  StringRef local_88;
  Section local_78;
  
  local_e0.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/functional/BasicClosure.cpp"
  ;
  local_e0.m_assertionInfo.macroName.m_size = 0x98;
  Catch::StringRef::StringRef(&local_88,"Copy fn.");
  Catch::Section::Section(&local_78,(SourceLineInfo *)&local_e0,local_88,(char *)0x0);
  bVar1 = Catch::Section::operator_cast_to_bool(&local_78);
  if (bVar1) {
    local_100._M_dataplus._M_p =
         "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/functional/BasicClosure.cpp"
    ;
    local_100._M_string_length = 0x9c;
    macroName.m_size = 7;
    macroName.m_start = "SUCCEED";
    Catch::AssertionHandler::AssertionHandler
              (&local_e0,macroName,(SourceLineInfo *)&local_100,(StringRef)ZEXT816(0x46a36f),
               ContinueOnFailure);
    local_118.m_index = 0;
    local_118.m_oss = (ostream *)0x0;
    Catch::ReusableStringStream::ReusableStringStream(&local_118);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_118.m_oss,"std::same_as<Closure<TestFun>, decltype(enclosed)>",0x32);
    Catch::ReusableStringStream::str_abi_cxx11_(&local_100,&local_118);
    message.m_size = local_100._M_string_length;
    message.m_start = local_100._M_dataplus._M_p;
    Catch::AssertionHandler::handleMessage(&local_e0,Ok,message);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    Catch::ReusableStringStream::~ReusableStringStream(&local_118);
    Catch::AssertionHandler::complete(&local_e0);
    if (local_e0.m_completed == false) {
      (*(local_e0.m_resultCapture)->_vptr_IResultCapture[0x14])();
    }
  }
  Catch::Section::~Section(&local_78);
  local_e0.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/functional/BasicClosure.cpp"
  ;
  local_e0.m_assertionInfo.macroName.m_size = 0x9f;
  Catch::StringRef::StringRef(&local_98,"Move fn.");
  Catch::Section::Section(&local_78,(SourceLineInfo *)&local_e0,local_98,(char *)0x0);
  bVar1 = Catch::Section::operator_cast_to_bool(&local_78);
  if (bVar1) {
    local_100._M_dataplus._M_p =
         "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/functional/BasicClosure.cpp"
    ;
    local_100._M_string_length = 0xa3;
    macroName_00.m_size = 7;
    macroName_00.m_start = "SUCCEED";
    Catch::AssertionHandler::AssertionHandler
              (&local_e0,macroName_00,(SourceLineInfo *)&local_100,(StringRef)ZEXT816(0x46a36f),
               ContinueOnFailure);
    local_118.m_index = 0;
    local_118.m_oss = (ostream *)0x0;
    Catch::ReusableStringStream::ReusableStringStream(&local_118);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_118.m_oss,"std::same_as<Closure<TestFun>, decltype(enclosed)>",0x32);
    Catch::ReusableStringStream::str_abi_cxx11_(&local_100,&local_118);
    message_00.m_size = local_100._M_string_length;
    message_00.m_start = local_100._M_dataplus._M_p;
    Catch::AssertionHandler::handleMessage(&local_e0,Ok,message_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    Catch::ReusableStringStream::~ReusableStringStream(&local_118);
    Catch::AssertionHandler::complete(&local_e0);
    if (local_e0.m_completed == false) {
      (*(local_e0.m_resultCapture)->_vptr_IResultCapture[0x14])();
    }
  }
  Catch::Section::~Section(&local_78);
  return;
}

Assistant:

constexpr auto operator ()(auto&&...) const noexcept
	{
	}